

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  ulong uVar2;
  TupleMake *pTVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Expression *local_78;
  uintptr_t *local_70;
  Type *t;
  Iterator __end1;
  undefined1 local_48 [8];
  Iterator __begin1;
  Type *__range1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = FeatureSet::hasMultivalue(&this->wasm->features);
  if (!bVar1) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x611,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  uVar2 = ::wasm::Type::isTuple();
  if ((uVar2 & 1) == 0) {
    __assert_fail("type.isTuple()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x612,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)&this_local;
  IVar4 = Type::begin((Type *)__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  local_48 = (undefined1  [8])
             IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          Type::end((Type *)__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
  while( true ) {
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar5.index;
    t = PVar5.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_48,
                       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
    if (!bVar1) break;
    local_70 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_48);
    local_78 = make(this,(Type)*local_70);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
               &local_78);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_48);
    PVar5.index = (size_t)__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar5.parent = t;
  }
  pTVar3 = Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  return (Expression *)pTVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}